

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::AddCMakePaths(cmake *this)

{
  bool bVar1;
  cmValue cVar2;
  string *psVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CMAKE_COMMAND",&local_39);
  cVar2.Value = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,cVar2,"Path to CMake executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CTEST_COMMAND",&local_39);
  cVar2.Value = cmSystemTools::GetCTestCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,cVar2,"Path to ctest program executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CPACK_COMMAND",&local_39);
  cVar2.Value = cmSystemTools::GetCPackCommand_abi_cxx11_();
  AddCacheEntry(this,&local_38,cVar2,"Path to cpack program executable.",4);
  std::__cxx11::string::~string((string *)&local_38);
  psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&local_38,psVar3,"/Modules/CMake.cmake");
  bVar1 = cmsys::SystemTools::FileExists(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    psVar3 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    std::operator+(&local_38,
                   "Could not find CMAKE_ROOT !!!\nCMake has most likely not been installed correctly.\nModules directory not found in\n"
                   ,psVar3);
    cmSystemTools::Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"CMAKE_ROOT",&local_39);
    cVar2.Value = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    AddCacheEntry(this,&local_38,cVar2,"Path to CMake installation.",4);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (uint)bVar1;
}

Assistant:

int cmake::AddCMakePaths()
{
  // Save the value in the cache
  this->AddCacheEntry("CMAKE_COMMAND", cmSystemTools::GetCMakeCommand(),
                      "Path to CMake executable.", cmStateEnums::INTERNAL);
#ifndef CMAKE_BOOTSTRAP
  this->AddCacheEntry("CMAKE_CTEST_COMMAND", cmSystemTools::GetCTestCommand(),
                      "Path to ctest program executable.",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CPACK_COMMAND", cmSystemTools::GetCPackCommand(),
                      "Path to cpack program executable.",
                      cmStateEnums::INTERNAL);
#endif
  if (!cmSystemTools::FileExists(
        (cmSystemTools::GetCMakeRoot() + "/Modules/CMake.cmake"))) {
    // couldn't find modules
    cmSystemTools::Error(
      "Could not find CMAKE_ROOT !!!\n"
      "CMake has most likely not been installed correctly.\n"
      "Modules directory not found in\n" +
      cmSystemTools::GetCMakeRoot());
    return 0;
  }
  this->AddCacheEntry("CMAKE_ROOT", cmSystemTools::GetCMakeRoot(),
                      "Path to CMake installation.", cmStateEnums::INTERNAL);

  return 1;
}